

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Modules.cpp
# Opt level: O2

string * getEnvImpl_abi_cxx11_(string *__return_storage_ptr__,char *name)

{
  char *pcVar1;
  allocator *paVar2;
  allocator local_a;
  allocator local_9;
  
  pcVar1 = getenv(name);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = "";
    paVar2 = &local_a;
  }
  else {
    paVar2 = &local_9;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,paVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string getEnvImpl(const char *name)
{
    #ifdef _MSC_VER
    const DWORD len = GetEnvironmentVariableA(name, 0, 0);
    if (len == 0) return "";
    char* buffer = new char[len];
    GetEnvironmentVariableA(name, buffer, len);
    std::string result(buffer);
    delete [] buffer;
    return result;
    #else
    const char *result = getenv(name);
    if (result != NULL) return result;
    #endif
    return "";
}